

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O2

void Abc_NtkExpandCubes(Abc_Ntk_t *pNtk,Gia_Man_t *pGia,int fVerbose)

{
  long lVar1;
  int iVar2;
  undefined8 in_RAX;
  Vec_Str_t *p;
  char *pcVar3;
  Gia_Man_t *p_00;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  p->pArray = pcVar3;
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8c,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  if (pNtk->vCis->nSize != pGia->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8d,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  pVVar4 = pNtk->vCos;
  iVar2 = pVVar4->nSize;
  if (iVar2 == pGia->vCos->nSize) {
    uVar5 = 0;
    do {
      uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38);
      if (iVar2 <= (int)uVar5) {
        free(p->pArray);
        free(p);
        Abc_NtkSortSops(pNtk);
        return;
      }
      if ((int)uVar5 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar1 = *(long *)(*(long *)(*(long *)(*pVVar4->pArray[uVar5] + 0x20) + 8) +
                       (long)**(int **)((long)pVVar4->pArray[uVar5] + 0x20) * 8);
      if (((*(uint *)(lVar1 + 0x14) & 0xf) == 7) && (*(int *)(lVar1 + 0x1c) != 0)) {
        if (*(int *)(lVar1 + 0x1c) != pGia->vCis->nSize) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                        ,0x94,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        p->nSize = 0;
        Vec_StrPrintStr(p,*(char **)(lVar1 + 0x38));
        Vec_StrPush(p,'\0');
        p_00 = Gia_ManDupCones(pGia,(int *)((long)&uStack_38 + 4),1,0);
        if (p_00->vCis->nSize != pGia->vCis->nSize) {
          __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                        ,0x9b,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        iVar2 = Abc_ObjExpandCubes(p,p_00,*(int *)(lVar1 + 0x1c));
        if (iVar2 != 0) {
          *(undefined4 *)(lVar1 + 0x1c) = 0;
        }
        Gia_ManStop(p_00);
        pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,p->pArray);
        *(char **)(lVar1 + 0x38) = pcVar3;
        pVVar4 = pNtk->vCos;
        iVar2 = pVVar4->nSize;
        uVar5 = uStack_38._4_4_;
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  __assert_fail("Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                ,0x8e,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
}

Assistant:

void Abc_NtkExpandCubes( Abc_Ntk_t * pNtk, Gia_Man_t * pGia, int fVerbose )
{
    Gia_Man_t * pNew;
    Abc_Obj_t * pObj; int i;
    Vec_Str_t * vSop = Vec_StrAlloc( 1000 );
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia) );
    assert( Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_ObjFanin0(pObj);
        if ( !Abc_ObjIsNode(pObj) || Abc_ObjFaninNum(pObj) == 0 )
            continue;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia) );

        Vec_StrClear( vSop );
        Vec_StrAppend( vSop, (char *)pObj->pData );
        Vec_StrPush( vSop, '\0' );

        pNew = Gia_ManDupCones( pGia, &i, 1, 0 );
        assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia) );
        if ( Abc_ObjExpandCubes( vSop, pNew, Abc_ObjFaninNum(pObj) ) )
            Vec_IntClear( &pObj->vFanins );
        Gia_ManStop( pNew );

        pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Vec_StrArray(vSop) );
    }
    Vec_StrFree( vSop );
    Abc_NtkSortSops( pNtk );
}